

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O0

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetLatencySampleName
          (VClient *this,uint i_SampleIndex,string *o_rSampleName)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  Enum local_3c;
  undefined1 local_38 [4];
  Enum GetResult;
  scoped_lock Lock;
  string *o_rSampleName_local;
  uint i_SampleIndex_local;
  VClient *this_local;
  
  Lock._8_8_ = o_rSampleName;
  boost::unique_lock<boost::recursive_mutex>::unique_lock
            ((unique_lock<boost::recursive_mutex> *)local_38,&this->m_FrameMutex);
  local_3c = Success;
  bVar1 = InitGet<std::__cxx11::string>
                    (this,&local_3c,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Lock._8_8_
                    );
  if (bVar1) {
    sVar2 = std::
            vector<ViconCGStreamDetail::VLatencyInfo_Sample,_std::allocator<ViconCGStreamDetail::VLatencyInfo_Sample>_>
            ::size(&(this->m_LatestFrame).m_Latency.m_Samples);
    if (i_SampleIndex < sVar2) {
      pvVar3 = std::
               vector<ViconCGStreamDetail::VLatencyInfo_Sample,_std::allocator<ViconCGStreamDetail::VLatencyInfo_Sample>_>
               ::operator[](&(this->m_LatestFrame).m_Latency.m_Samples,(ulong)i_SampleIndex);
      std::__cxx11::string::operator=((string *)Lock._8_8_,(string *)pvVar3);
      this_local._4_4_ = Success;
    }
    else {
      this_local._4_4_ = InvalidIndex;
    }
  }
  else {
    this_local._4_4_ = local_3c;
  }
  boost::unique_lock<boost::recursive_mutex>::~unique_lock
            ((unique_lock<boost::recursive_mutex> *)local_38);
  return this_local._4_4_;
}

Assistant:

Result::Enum VClient::GetLatencySampleName( const unsigned int i_SampleIndex, std::string & o_rSampleName ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );
  
  Result::Enum GetResult = Result::Success;
  if ( !InitGet( GetResult, o_rSampleName ) )
  {
    return GetResult; 
  }

  if( i_SampleIndex >= m_LatestFrame.m_Latency.m_Samples.size() )
  {
    return Result::InvalidIndex;
  }

  o_rSampleName = m_LatestFrame.m_Latency.m_Samples[ i_SampleIndex ].m_Name;

  return Result::Success;
}